

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkTransferCopy(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  Vec_Ptr_t *pVVar5;
  
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar3 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar3];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) != 6)) {
        uVar4 = *(ulong *)((long)pvVar1 + 0x40);
        if (uVar4 == 0) {
          uVar4 = 0;
        }
        else {
          uVar2 = *(ulong *)((uVar4 & 0xfffffffffffffffe) + 0x40);
          uVar4 = (uint)uVar4 & 1 ^ uVar2;
          if (uVar2 == 0) {
            uVar4 = 0;
          }
        }
        *(ulong *)((long)pvVar1 + 0x40) = uVar4;
        pVVar5 = pNtk->vObjs;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTransferCopy( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsNet(pObj) )
            pObj->pCopy = pObj->pCopy? Abc_ObjCopyCond(pObj->pCopy) : NULL;
}